

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::SharedMemoryArbiterImpl::FlushPendingCommitDataRequests
          (SharedMemoryArbiterImpl *this,function<void_()> *callback)

{
  ProducerEndpoint *pPVar1;
  undefined4 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  pointer this_00;
  vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
  *this_01;
  reference this_02;
  type pCVar8;
  function<void_()> local_1a0;
  CommitDataRequest local_180;
  function<void_()> local_118;
  Chunk local_f8;
  undefined1 local_e8 [8];
  Chunk chunk;
  ChunkState chunk_state;
  uint32_t layout;
  CommitDataRequest_ChunksToMove *ctm;
  const_iterator __end3;
  const_iterator __begin3;
  vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
  *__range3;
  undefined1 local_a8 [7];
  bool all_placeholders_replaced;
  function<void_()> local_98;
  function<void_()> local_78;
  undefined1 local_58 [8];
  WeakPtr<perfetto::SharedMemoryArbiterImpl> weak_this;
  TaskRunner *task_runner;
  undefined1 local_30 [8];
  unique_lock<std::mutex> scoped_lock;
  unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
  req;
  function<void_()> *callback_local;
  SharedMemoryArbiterImpl *this_local;
  
  ::std::
  unique_ptr<perfetto::protos::gen::CommitDataRequest,std::default_delete<perfetto::protos::gen::CommitDataRequest>>
  ::unique_ptr<std::default_delete<perfetto::protos::gen::CommitDataRequest>,void>
            ((unique_ptr<perfetto::protos::gen::CommitDataRequest,std::default_delete<perfetto::protos::gen::CommitDataRequest>>
              *)&scoped_lock._M_owns);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->lock_);
  if ((this->fully_bound_ & 1U) == 0) {
    bVar4 = ::std::function::operator_cast_to_bool((function *)callback);
    if (bVar4) {
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
                (&this->pending_flush_callbacks_,callback);
    }
    bVar4 = true;
  }
  else {
    weak_this.handle_.
    super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->task_runner_;
    uVar5 = (*(weak_this.handle_.
               super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base[6])();
    if ((uVar5 & 1) == 0) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_30);
      perfetto::base::WeakPtrFactory<perfetto::SharedMemoryArbiterImpl>::GetWeakPtr
                ((WeakPtrFactory<perfetto::SharedMemoryArbiterImpl> *)local_58);
      _Var3 = weak_this.handle_.
              super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      perfetto::base::WeakPtr<perfetto::SharedMemoryArbiterImpl>::WeakPtr
                ((WeakPtr<perfetto::SharedMemoryArbiterImpl> *)local_a8,
                 (WeakPtr<perfetto::SharedMemoryArbiterImpl> *)local_58);
      ::std::function<void_()>::function(&local_98,(function<void_()> *)callback);
      ::std::function<void()>::
      function<perfetto::SharedMemoryArbiterImpl::FlushPendingCommitDataRequests(std::function<void()>)::__0,void>
                ((function<void()> *)&local_78,(anon_class_48_2_3e655360 *)local_a8);
      (*(_Var3._M_pi)->_vptr__Sp_counted_base[2])(_Var3._M_pi,&local_78);
      ::std::function<void_()>::~function(&local_78);
      FlushPendingCommitDataRequests(std::function<void()>)::$_0::~__0((__0 *)local_a8);
      bVar4 = true;
      perfetto::base::WeakPtr<perfetto::SharedMemoryArbiterImpl>::~WeakPtr
                ((WeakPtr<perfetto::SharedMemoryArbiterImpl> *)local_58);
    }
    else {
      bVar4 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->commit_data_req_);
      if (bVar4) {
        ReplaceCommitPlaceholderBufferIdsLocked(this);
        this_00 = std::
                  unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                  ::operator->(&this->commit_data_req_);
        this_01 = protos::gen::CommitDataRequest::chunks_to_move(this_00);
        __end3 = std::
                 vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
                 ::begin(this_01);
        ctm = (CommitDataRequest_ChunksToMove *)
              std::
              vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
              ::end(this_01);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunksToMove_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>_>
                                           *)&ctm), bVar4) {
          this_02 = __gnu_cxx::
                    __normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunksToMove_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>_>
                    ::operator*(&__end3);
          uVar6 = protos::gen::CommitDataRequest_ChunksToMove::page(this_02);
          uVar6 = SharedMemoryABI::GetPageLayout(&this->shmem_abi_,(ulong)uVar6);
          chunk._12_4_ = uVar6;
          uVar7 = protos::gen::CommitDataRequest_ChunksToMove::chunk(this_02);
          chunk._8_4_ = SharedMemoryABI::GetChunkStateFromLayout(uVar6,(ulong)uVar7);
          if (chunk._8_4_ == kChunkBeingWritten) {
            uVar6 = protos::gen::CommitDataRequest_ChunksToMove::page(this_02);
            uVar2 = chunk._12_4_;
            protos::gen::CommitDataRequest_ChunksToMove::chunk(this_02);
            SharedMemoryABI::GetChunkUnchecked
                      ((SharedMemoryABI *)local_e8,(size_t)&this->shmem_abi_,uVar6,
                       (ulong)(uint)uVar2);
            SharedMemoryABI::Chunk::Chunk(&local_f8,(Chunk *)local_e8);
            SharedMemoryABI::ReleaseChunkAsComplete(&this->shmem_abi_,&local_f8);
          }
          __gnu_cxx::
          __normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunksToMove_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>_>
          ::operator++(&__end3);
        }
        std::
        unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
        ::operator=((unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                     *)&scoped_lock._M_owns,&this->commit_data_req_);
        this->bytes_pending_commit_ = 0;
      }
      bVar4 = false;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  if (!bVar4) {
    bVar4 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&scoped_lock._M_owns);
    if (bVar4) {
      pPVar1 = this->producer_endpoint_;
      pCVar8 = std::
               unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
               ::operator*((unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                            *)&scoped_lock._M_owns);
      ::std::function<void_()>::function(&local_118,(function<void_()> *)callback);
      (*pPVar1->_vptr_ProducerEndpoint[7])(pPVar1,pCVar8,&local_118);
      ::std::function<void_()>::~function(&local_118);
    }
    else {
      bVar4 = ::std::function::operator_cast_to_bool((function *)callback);
      if (bVar4) {
        pPVar1 = this->producer_endpoint_;
        protos::gen::CommitDataRequest::CommitDataRequest(&local_180);
        std::function<void_()>::function(&local_1a0,callback);
        (*pPVar1->_vptr_ProducerEndpoint[7])(pPVar1,&local_180,&local_1a0);
        ::std::function<void_()>::~function((function<void_()> *)&local_1a0);
        protos::gen::CommitDataRequest::~CommitDataRequest(&local_180);
      }
    }
  }
  std::
  unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
  ::~unique_ptr((unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
                 *)&scoped_lock._M_owns);
  return;
}

Assistant:

void SharedMemoryArbiterImpl::FlushPendingCommitDataRequests(
    std::function<void()> callback) {
  std::unique_ptr<CommitDataRequest> req;
  {
    std::unique_lock<std::mutex> scoped_lock(lock_);

    // Flushing is only supported while |fully_bound_|, and there may still be
    // unbound startup trace writers. If so, skip the commit for now - it'll be
    // done when |fully_bound_| is updated.
    if (!fully_bound_) {
      if (callback)
        pending_flush_callbacks_.push_back(callback);
      return;
    }

    // May be called by TraceWriterImpl on any thread.
    base::TaskRunner* task_runner = task_runner_;
    if (!task_runner->RunsTasksOnCurrentThread()) {
      // We shouldn't post a task while holding a lock. |task_runner| remains
      // valid after unlocking, because |task_runner_| is never reset.
      scoped_lock.unlock();

      auto weak_this = weak_ptr_factory_.GetWeakPtr();
      task_runner->PostTask([weak_this, callback] {
        if (weak_this)
          weak_this->FlushPendingCommitDataRequests(std::move(callback));
      });
      return;
    }

    // |commit_data_req_| could have become a nullptr, for example when a forced
    // sync flush happens in GetNewChunk().
    if (commit_data_req_) {
      // Make sure any placeholder buffer IDs from StartupWriters are replaced
      // before sending the request.
      bool all_placeholders_replaced =
          ReplaceCommitPlaceholderBufferIdsLocked();
      // We're |fully_bound_|, thus all writers are bound and all placeholders
      // should have been replaced.
      PERFETTO_DCHECK(all_placeholders_replaced);

      // In order to allow patching in the producer we delay the kChunkComplete
      // transition and keep batched chunks in the kChunkBeingWritten state.
      // Since we are about to notify the service of all batched chunks, it will
      // not be possible to apply any more patches to them and we need to move
      // them to kChunkComplete - otherwise the service won't look at them.
      for (auto& ctm : commit_data_req_->chunks_to_move()) {
        uint32_t layout = shmem_abi_.GetPageLayout(ctm.page());
        auto chunk_state =
            shmem_abi_.GetChunkStateFromLayout(layout, ctm.chunk());
        // Note: the subset of |commit_data_req_| chunks that still need
        // patching is also the subset of chunks that are still being written
        // to. The rest of the chunks in |commit_data_req_| do not need patching
        // and have already been marked as complete.
        if (chunk_state != SharedMemoryABI::kChunkBeingWritten)
          continue;

        SharedMemoryABI::Chunk chunk =
            shmem_abi_.GetChunkUnchecked(ctm.page(), layout, ctm.chunk());
        shmem_abi_.ReleaseChunkAsComplete(std::move(chunk));
      }

      req = std::move(commit_data_req_);
      bytes_pending_commit_ = 0;
    }
  }  // scoped_lock

  if (req) {
    producer_endpoint_->CommitData(*req, callback);
  } else if (callback) {
    // If |req| was nullptr, it means that an enqueued deferred commit was
    // executed just before this. At this point send an empty commit request
    // to the service, just to linearize with it and give the guarantee to the
    // caller that the data has been flushed into the service.
    producer_endpoint_->CommitData(CommitDataRequest(), std::move(callback));
  }
}